

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_example_tweaks(options_i *options,vw *all)

{
  float *location;
  float *location_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  option_group_definition *poVar4;
  typed_option<unsigned_int> *ptVar5;
  typed_option<unsigned_long> *ptVar6;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar7;
  typed_option<float> *ptVar8;
  namedlabels *pnVar9;
  ostream *poVar10;
  loss_function *plVar11;
  byte bVar12;
  float fVar13;
  float fVar14;
  bool test_only;
  allocator local_1b08;
  allocator local_1b07;
  allocator local_1b06;
  allocator local_1b05;
  allocator local_1b04;
  allocator local_1b03;
  allocator local_1b02;
  allocator local_1b01;
  allocator local_1b00;
  allocator local_1aff;
  allocator local_1afe;
  allocator local_1afd;
  allocator local_1afc;
  allocator local_1afb;
  allocator local_1afa;
  allocator local_1af9;
  allocator local_1af8;
  allocator local_1af7;
  allocator local_1af6;
  allocator local_1af5;
  allocator local_1af4;
  allocator local_1af3;
  allocator local_1af2;
  allocator local_1af1;
  allocator local_1af0;
  allocator local_1aef;
  allocator local_1aee;
  allocator local_1aed;
  allocator local_1aec;
  allocator local_1aeb;
  allocator local_1aea;
  allocator local_1ae9;
  allocator local_1ae8;
  allocator local_1ae7;
  allocator local_1ae6;
  allocator local_1ae5;
  float loss_parameter;
  size_t *local_1ae0;
  bool *local_1ad8;
  string loss_function;
  string named_labels;
  string local_1a90;
  string local_1a70;
  string local_1a50 [32];
  string local_1a30;
  string local_1a10 [32];
  string local_19f0;
  string local_19d0 [32];
  string local_19b0;
  string local_1990 [32];
  string local_1970;
  string local_1950 [32];
  string local_1930;
  string local_1910 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f0;
  string local_18d0;
  string local_18b0 [32];
  string local_1890;
  string local_1870 [32];
  string local_1850;
  string local_1830 [32];
  string local_1810;
  string local_17f0 [32];
  string local_17d0;
  string local_17b0 [32];
  string local_1790;
  string local_1770 [32];
  string local_1750;
  string local_1730 [32];
  string local_1710;
  string local_16f0 [32];
  string local_16d0;
  string local_16b0 [32];
  string local_1690;
  string local_1670 [32];
  string local_1650;
  string local_1630 [32];
  string local_1610 [32];
  string local_15f0;
  undefined1 local_15d0 [80];
  string local_1580 [80];
  string local_1530;
  size_t early_terminate_passes;
  option_group_definition example_options;
  undefined1 local_14d0 [160];
  undefined1 local_1430 [112];
  bool local_13c0;
  undefined1 local_1390 [160];
  undefined1 local_12f0 [160];
  undefined1 local_1250 [160];
  undefined1 local_11b0 [160];
  undefined1 local_1110 [160];
  undefined1 local_1070 [160];
  undefined1 local_fd0 [160];
  undefined1 local_f30 [160];
  undefined1 local_e90 [160];
  undefined1 local_df0 [160];
  typed_option<unsigned_int> local_d50;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cb0;
  typed_option<bool> local_c10;
  typed_option<float> local_b70;
  typed_option<float> local_ad0;
  typed_option<float> local_a30;
  typed_option<float> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_850;
  typed_option<bool> local_7b0;
  typed_option<float> local_710;
  typed_option<float> local_670;
  typed_option<unsigned_long> local_5d0;
  typed_option<unsigned_long> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<unsigned_long> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_int> local_2b0;
  typed_option<unsigned_int> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  named_labels._M_dataplus._M_p = (pointer)&named_labels.field_2;
  named_labels._M_string_length = 0;
  named_labels.field_2._M_local_buf[0] = '\0';
  loss_function._M_dataplus._M_p = (pointer)&loss_function.field_2;
  loss_function._M_string_length = 0;
  loss_function.field_2._M_local_buf[0] = '\0';
  loss_parameter = 0.0;
  test_only = false;
  std::__cxx11::string::string((string *)&local_1530,"Example options",(allocator *)local_15d0);
  VW::config::option_group_definition::option_group_definition(&example_options,&local_1530);
  std::__cxx11::string::~string((string *)&local_1530);
  std::__cxx11::string::string((string *)&local_15f0,"testonly",&local_1ae5);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_15d0,&local_15f0,&test_only);
  std::__cxx11::string::string(local_1610,"t",&local_1ae6);
  std::__cxx11::string::_M_assign(local_1580);
  std::__cxx11::string::string(local_1630,"Ignore label information and just test",&local_1ae7);
  std::__cxx11::string::_M_assign((string *)(local_15d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_15d0);
  poVar4 = VW::config::option_group_definition::add<bool>(&example_options,&local_d0);
  std::__cxx11::string::string((string *)&local_1650,"holdout_off",&local_1ae8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_14d0,&local_1650,&all->holdout_set_off);
  std::__cxx11::string::string(local_1670,"no holdout data in multiple passes",&local_1ae9);
  std::__cxx11::string::_M_assign((string *)(local_14d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_14d0);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_170);
  std::__cxx11::string::string((string *)&local_1690,"holdout_period",&local_1aea);
  VW::config::typed_option<unsigned_int>::typed_option(&local_d50,&local_1690,&all->holdout_period);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_d50,10);
  std::__cxx11::string::string(local_16b0,"holdout period for test only",&local_1aeb);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_210,ptVar5);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(poVar4,&local_210);
  std::__cxx11::string::string((string *)&local_16d0,"holdout_after",&local_1aec);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_1390,&local_16d0,&all->holdout_after);
  std::__cxx11::string::string
            (local_16f0,"holdout after n training examples, default off (disables holdout_period)",
             &local_1aed);
  std::__cxx11::string::_M_assign((string *)(local_1390 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_2b0,(typed_option<unsigned_int> *)local_1390);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(poVar4,&local_2b0);
  std::__cxx11::string::string((string *)&local_1710,"early_terminate",&local_1aee);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_3f0,&local_1710,&early_terminate_passes);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_3f0,3);
  std::__cxx11::string::string
            (local_1730,
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,&local_1aef);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,ptVar6);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_350);
  local_1ad8 = &all->holdout_set_off;
  std::__cxx11::string::string((string *)&local_1750,"passes",&local_1af0);
  local_1ae0 = &all->numpasses;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_df0,&local_1750,local_1ae0);
  std::__cxx11::string::string(local_1770,"Number of Training Passes",&local_1af1);
  std::__cxx11::string::_M_assign((string *)(local_df0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_490,(typed_option<unsigned_long> *)local_df0);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_490);
  std::__cxx11::string::string((string *)&local_1790,"initial_pass_length",&local_1af2);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_e90,&local_1790,&all->pass_length);
  std::__cxx11::string::string(local_17b0,"initial number of examples per pass",&local_1af3);
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_530,(typed_option<unsigned_long> *)local_e90);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_530);
  std::__cxx11::string::string((string *)&local_17d0,"examples",&local_1af4);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_f30,&local_17d0,&all->max_examples);
  std::__cxx11::string::string(local_17f0,"number of examples to parse",&local_1af5);
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_5d0,(typed_option<unsigned_long> *)local_f30);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_5d0);
  std::__cxx11::string::string((string *)&local_1810,"min_prediction",&local_1af6);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_fd0,&local_1810,&all->sd->min_label);
  std::__cxx11::string::string(local_1830,"Smallest prediction to output",&local_1af7);
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_670,(typed_option<float> *)local_fd0);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_670);
  std::__cxx11::string::string((string *)&local_1850,"max_prediction",&local_1af8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1070,&local_1850,&all->sd->max_label);
  std::__cxx11::string::string(local_1870,"Largest prediction to output",&local_1af9);
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_710,(typed_option<float> *)local_1070);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_710);
  std::__cxx11::string::string((string *)&local_1890,"sort_features",&local_1afa);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1110,&local_1890,&all->p->sort_features);
  std::__cxx11::string::string
            (local_18b0,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,&local_1afb);
  std::__cxx11::string::_M_assign((string *)(local_1110 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_1110);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_7b0);
  std::__cxx11::string::string((string *)&local_18d0,"loss_function",&local_1afc);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,&local_18d0,&loss_function);
  std::__cxx11::string::string((string *)&local_18f0,"squared",&local_1afd);
  ptVar7 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_8f0,&local_18f0);
  std::__cxx11::string::string
            (local_1910,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,&local_1afe);
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_850,ptVar7);
  poVar4 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_850);
  std::__cxx11::string::string((string *)&local_1930,"quantile_tau",&local_1aff);
  VW::config::typed_option<float>::typed_option(&local_a30,&local_1930,&loss_parameter);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_a30,0.5);
  std::__cxx11::string::string
            (local_1950,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",&local_1b00
            );
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_990,ptVar8);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_990);
  std::__cxx11::string::string((string *)&local_1970,"l1",&local_1b01);
  location = &all->l1_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_11b0,&local_1970,location);
  std::__cxx11::string::string(local_1990,"l_1 lambda",&local_1b02);
  std::__cxx11::string::_M_assign((string *)(local_11b0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_ad0,(typed_option<float> *)local_11b0);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_ad0);
  std::__cxx11::string::string((string *)&local_19b0,"l2",&local_1b03);
  location_00 = &all->l2_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1250,&local_19b0,location_00);
  std::__cxx11::string::string(local_19d0,"l_2 lambda",&local_1b04);
  std::__cxx11::string::_M_assign((string *)(local_1250 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_b70,(typed_option<float> *)local_1250);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_b70);
  std::__cxx11::string::string((string *)&local_19f0,"no_bias_regularization",&local_1b05);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_12f0,&local_19f0,&all->no_bias);
  std::__cxx11::string::string(local_1a10,"no bias in regularization",&local_1b06);
  std::__cxx11::string::_M_assign((string *)(local_12f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c10,(typed_option<bool> *)local_12f0);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_c10);
  std::__cxx11::string::string((string *)&local_1a30,"named_labels",&local_1b07);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430,&local_1a30,&named_labels);
  local_13c0 = true;
  std::__cxx11::string::string
            (local_1a50,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,&local_1b08);
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_cb0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_cb0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_cb0);
  std::__cxx11::string::~string(local_1a50);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1430);
  std::__cxx11::string::~string((string *)&local_1a30);
  VW::config::typed_option<bool>::~typed_option(&local_c10);
  std::__cxx11::string::~string(local_1a10);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_12f0);
  std::__cxx11::string::~string((string *)&local_19f0);
  VW::config::typed_option<float>::~typed_option(&local_b70);
  std::__cxx11::string::~string(local_19d0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_1250);
  std::__cxx11::string::~string((string *)&local_19b0);
  VW::config::typed_option<float>::~typed_option(&local_ad0);
  std::__cxx11::string::~string(local_1990);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_11b0);
  std::__cxx11::string::~string((string *)&local_1970);
  VW::config::typed_option<float>::~typed_option(&local_990);
  std::__cxx11::string::~string(local_1950);
  VW::config::typed_option<float>::~typed_option(&local_a30);
  std::__cxx11::string::~string((string *)&local_1930);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_850);
  std::__cxx11::string::~string(local_1910);
  std::__cxx11::string::~string((string *)&local_18f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_8f0);
  std::__cxx11::string::~string((string *)&local_18d0);
  VW::config::typed_option<bool>::~typed_option(&local_7b0);
  std::__cxx11::string::~string(local_18b0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1110);
  std::__cxx11::string::~string((string *)&local_1890);
  VW::config::typed_option<float>::~typed_option(&local_710);
  std::__cxx11::string::~string(local_1870);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_1070);
  std::__cxx11::string::~string((string *)&local_1850);
  VW::config::typed_option<float>::~typed_option(&local_670);
  std::__cxx11::string::~string(local_1830);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_fd0);
  std::__cxx11::string::~string((string *)&local_1810);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_5d0);
  std::__cxx11::string::~string(local_17f0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_f30);
  std::__cxx11::string::~string((string *)&local_17d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_530);
  std::__cxx11::string::~string(local_17b0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_e90);
  std::__cxx11::string::~string((string *)&local_1790);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_490);
  std::__cxx11::string::~string(local_1770);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_df0);
  std::__cxx11::string::~string((string *)&local_1750);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_350);
  std::__cxx11::string::~string(local_1730);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_3f0);
  std::__cxx11::string::~string((string *)&local_1710);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_2b0);
  std::__cxx11::string::~string(local_16f0);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_1390);
  std::__cxx11::string::~string((string *)&local_16d0);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_210);
  std::__cxx11::string::~string(local_16b0);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_d50);
  std::__cxx11::string::~string((string *)&local_1690);
  VW::config::typed_option<bool>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_1670);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_14d0);
  std::__cxx11::string::~string((string *)&local_1650);
  VW::config::typed_option<bool>::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_1630);
  std::__cxx11::string::~string(local_1610);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_15d0);
  std::__cxx11::string::~string((string *)&local_15f0);
  (**options->_vptr_options_i)(options,&example_options);
  if ((test_only == false) && ((all->eta != 0.0 || (NAN(all->eta))))) {
    all->training = true;
  }
  else {
    if (all->quiet == false) {
      poVar10 = std::operator<<(&(all->trace_message).super_ostream,"only testing");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    all->training = false;
    if (all->lda != 0) {
      all->eta = 0.0;
    }
  }
  if (((*local_1ae0 < 2) && (all->holdout_after == 0)) || (*local_1ad8 == true)) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  *local_1ad8 = bVar1;
  std::__cxx11::string::string((string *)local_15d0,"min_prediction",(allocator *)&local_d50);
  iVar2 = (*options->_vptr_options_i[1])(options,local_15d0);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_14d0,"max_prediction",(allocator *)local_1390);
    iVar2 = (*options->_vptr_options_i[1])(options,local_14d0);
    bVar12 = (byte)iVar2 | test_only;
    std::__cxx11::string::~string((string *)local_14d0);
    std::__cxx11::string::~string((string *)local_15d0);
    if ((bVar12 & 1) == 0) goto LAB_00124c6a;
  }
  else {
    std::__cxx11::string::~string((string *)local_15d0);
  }
  all->set_minmax = noop_mm;
LAB_00124c6a:
  std::__cxx11::string::string((string *)local_15d0,"named_labels",(allocator *)local_14d0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_15d0);
  std::__cxx11::string::~string((string *)local_15d0);
  if ((char)iVar2 != '\0') {
    pnVar9 = calloc_or_throw<namedlabels>();
    all->sd->ldict = pnVar9;
    pnVar9 = all->sd->ldict;
    std::__cxx11::string::string((string *)&local_1a70,(string *)&named_labels);
    namedlabels::namedlabels(pnVar9,&local_1a70);
    std::__cxx11::string::~string((string *)&local_1a70);
    if (all->quiet == false) {
      poVar10 = std::operator<<(&(all->trace_message).super_ostream,"parsed ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," named labels");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
  }
  std::__cxx11::string::string((string *)&local_1a90,(string *)&loss_function);
  plVar11 = getLossFunction(all,&local_1a90,loss_parameter);
  all->loss = plVar11;
  std::__cxx11::string::~string((string *)&local_1a90);
  fVar13 = all->l1_lambda;
  if (fVar13 < 0.0) {
    poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                              "l1_lambda should be nonnegative: resetting from ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,*location);
    poVar10 = std::operator<<(poVar10," to 0");
    std::endl<char,std::char_traits<char>>(poVar10);
    *location = 0.0;
    fVar13 = 0.0;
  }
  fVar14 = *location_00;
  if (fVar14 < 0.0) {
    poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                              "l2_lambda should be nonnegative: resetting from ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,*location_00);
    poVar10 = std::operator<<(poVar10," to 0");
    std::endl<char,std::char_traits<char>>(poVar10);
    *location_00 = 0.0;
    fVar13 = *location;
    fVar14 = 0.0;
  }
  uVar3 = (uint)(0.0 < fVar13) + all->reg_mode;
  all->reg_mode = uVar3 + (uint)(0.0 < fVar14) * 2;
  if (all->quiet == false) {
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::string((string *)local_15d0,"bfgs",(allocator *)local_14d0);
      iVar2 = (*options->_vptr_options_i[1])(options,local_15d0);
      std::__cxx11::string::~string((string *)local_15d0);
      if ((char)iVar2 == '\0') {
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,"using l1 regularization = ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*location);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
    if (1 < all->reg_mode) {
      poVar10 = std::operator<<(&(all->trace_message).super_ostream,"using l2 regularization = ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,*location_00);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
  }
  VW::config::option_group_definition::~option_group_definition(&example_options);
  std::__cxx11::string::~string((string *)&loss_function);
  std::__cxx11::string::~string((string *)&named_labels);
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}